

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall bssl::ParseKeyUsage(bssl *this,Input key_usage_tlv,BitString *key_usage)

{
  Input input;
  bool bVar1;
  BitString *pBVar2;
  undefined1 local_70 [8];
  optional<bssl::der::BitString> key_usage_internal;
  undefined1 local_40 [8];
  Parser parser;
  BitString *key_usage_local;
  Input key_usage_tlv_local;
  
  parser.advance_len_ = key_usage_tlv.data_.size_;
  input.data_.size_ = (size_t)key_usage_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  key_usage_internal.super__Optional_base<bssl::der::BitString,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::der::BitString>._24_8_ = this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::ReadBitString((optional<bssl::der::BitString> *)local_70,(Parser *)local_40);
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_70);
  if (bVar1) {
    bVar1 = der::Parser::HasMore((Parser *)local_40);
    if (bVar1) {
      key_usage_tlv_local.data_.size_._7_1_ = false;
    }
    else {
      pBVar2 = ::std::optional<bssl::der::BitString>::value
                         ((optional<bssl::der::BitString> *)local_70);
      bVar1 = anon_unknown_0::BitStringIsAllZeros(pBVar2);
      if (bVar1) {
        key_usage_tlv_local.data_.size_._7_1_ = false;
      }
      else {
        pBVar2 = ::std::optional<bssl::der::BitString>::value
                           ((optional<bssl::der::BitString> *)local_70);
        *(uchar **)parser.advance_len_ = (pBVar2->bytes_).data_.data_;
        *(size_t *)(parser.advance_len_ + 8) = (pBVar2->bytes_).data_.size_;
        *(uint8_t *)(parser.advance_len_ + 0x10) = pBVar2->unused_bits_;
        key_usage_tlv_local.data_.size_._7_1_ = true;
      }
    }
  }
  else {
    key_usage_tlv_local.data_.size_._7_1_ = false;
  }
  return key_usage_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseKeyUsage(der::Input key_usage_tlv, der::BitString *key_usage) {
  der::Parser parser(key_usage_tlv);
  std::optional<der::BitString> key_usage_internal = parser.ReadBitString();
  if (!key_usage_internal) {
    return false;
  }

  // By definition the input was a single BIT STRING.
  if (parser.HasMore()) {
    return false;
  }

  // RFC 5280 section 4.2.1.3:
  //
  //     When the keyUsage extension appears in a certificate, at least
  //     one of the bits MUST be set to 1.
  if (BitStringIsAllZeros(key_usage_internal.value())) {
    return false;
  }

  *key_usage = key_usage_internal.value();
  return true;
}